

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O0

int forkfd_fork_fallback(int flags,pid_t *ppid)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  ProcessInfo *entry;
  int *piVar4;
  ssize_t sVar5;
  __pid_t *in_RSI;
  long in_FS_OFFSET;
  bool bVar6;
  eventfd_t val64_1;
  int efd;
  int ret;
  int fd;
  pid_t pid;
  ProcessInfo *info;
  char c;
  eventfd_t val64;
  Header *header;
  int sync_pipe [2];
  int death_pipe [2];
  int in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff89;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined1 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  int local_50;
  Header **header_00;
  int local_30;
  undefined1 local_29;
  undefined1 *local_28;
  Header *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (Header *)&DAT_aaaaaaaaaaaaaaaa;
  header_00 = (Header **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  pthread_once(&forkfd_initialization,forkfd_initialize);
  entry = allocateInfo(header_00);
  if (entry == (ProcessInfo *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
    local_30 = -1;
  }
  else {
    iVar1 = create_pipe((int *)CONCAT17(in_stack_ffffffffffffff8f,
                                        CONCAT16(in_stack_ffffffffffffff8e,
                                                 CONCAT15(in_stack_ffffffffffffff8d,
                                                          CONCAT14(in_stack_ffffffffffffff8c,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff8b,
                                                  CONCAT12(in_stack_ffffffffffffff8a,
                                                           CONCAT11(in_stack_ffffffffffffff89,
                                                                    in_stack_ffffffffffffff88)))))))
                        ,in_stack_ffffffffffffff84);
    if (iVar1 != -1) {
      iVar1 = eventfd(0,0x80000);
      if ((iVar1 != -1) ||
         (iVar2 = create_pipe((int *)CONCAT17(in_stack_ffffffffffffff8f,
                                              CONCAT16(in_stack_ffffffffffffff8e,
                                                       CONCAT15(in_stack_ffffffffffffff8d,
                                                                CONCAT14(in_stack_ffffffffffffff8c,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffff8b,
                                                  CONCAT12(in_stack_ffffffffffffff8a,
                                                           CONCAT11(in_stack_ffffffffffffff89,
                                                                    in_stack_ffffffffffffff88)))))))
                              ,in_stack_ffffffffffffff84), iVar2 != -1)) {
        _Var3 = fork();
        if (_Var3 != -1) {
          if (in_RSI != (__pid_t *)0x0) {
            *in_RSI = _Var3;
          }
          if (_Var3 == 0) {
            if (iVar1 == -1) {
              local_29 = 0xaa;
              do {
                iVar1 = close(local_18._4_4_);
                bVar6 = false;
                if (iVar1 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
              do {
                sVar5 = read((int)local_18,&local_29,1);
                bVar6 = false;
                if ((int)sVar5 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
              do {
                iVar1 = close((int)local_18);
                bVar6 = false;
                if (iVar1 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
            }
            else {
              local_28 = &DAT_aaaaaaaaaaaaaaaa;
              do {
                iVar2 = eventfd_read(iVar1,(eventfd_t *)&local_28);
                bVar6 = false;
                if (iVar2 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
              do {
                iVar2 = close(iVar1);
                bVar6 = false;
                if (iVar2 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
            }
            do {
              iVar1 = close((int)local_10);
              bVar6 = false;
              if (iVar1 == -1) {
                piVar4 = __errno_location();
                bVar6 = *piVar4 == 4;
              }
            } while (bVar6);
            do {
              iVar1 = close(local_10._4_4_);
              bVar6 = false;
              if (iVar1 == -1) {
                piVar4 = __errno_location();
                bVar6 = *piVar4 == 4;
              }
            } while (bVar6);
            local_50 = -2;
          }
          else {
            entry->deathPipe = local_10._4_4_;
            local_50 = (int)local_10;
            entry->pid = _Var3;
            if (iVar1 == -1) {
              do {
                iVar1 = close((int)local_18);
                bVar6 = false;
                if (iVar1 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
              do {
                sVar5 = write(local_18._4_4_,"",1);
                bVar6 = false;
                if ((int)sVar5 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
              do {
                iVar1 = close(local_18._4_4_);
                bVar6 = false;
                if (iVar1 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
            }
            else {
              do {
                iVar2 = eventfd_write(iVar1,0x2a);
                bVar6 = false;
                if (iVar2 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
              do {
                iVar2 = close(iVar1);
                bVar6 = false;
                if (iVar2 == -1) {
                  piVar4 = __errno_location();
                  bVar6 = *piVar4 == 4;
                }
              } while (bVar6);
            }
          }
          local_30 = local_50;
          goto LAB_007d95e5;
        }
        if (iVar1 == -1) {
          do {
            iVar1 = close((int)local_18);
            bVar6 = false;
            if (iVar1 == -1) {
              piVar4 = __errno_location();
              bVar6 = *piVar4 == 4;
            }
          } while (bVar6);
          do {
            iVar1 = close(local_18._4_4_);
            bVar6 = false;
            if (iVar1 == -1) {
              piVar4 = __errno_location();
              bVar6 = *piVar4 == 4;
            }
          } while (bVar6);
        }
        else {
          do {
            iVar2 = close(iVar1);
            bVar6 = false;
            if (iVar2 == -1) {
              piVar4 = __errno_location();
              bVar6 = *piVar4 == 4;
            }
          } while (bVar6);
        }
      }
      do {
        iVar1 = close((int)local_10);
        bVar6 = false;
        if (iVar1 == -1) {
          piVar4 = __errno_location();
          bVar6 = *piVar4 == 4;
        }
      } while (bVar6);
      do {
        iVar1 = close(local_10._4_4_);
        bVar6 = false;
        if (iVar1 == -1) {
          piVar4 = __errno_location();
          bVar6 = *piVar4 == 4;
        }
      } while (bVar6);
    }
    freeInfo(local_20,entry);
    local_30 = -1;
  }
LAB_007d95e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static int forkfd_fork_fallback(int flags, pid_t *ppid)
{
    Header *header;
    ProcessInfo *info;
    pid_t pid;
    int fd = -1;
    int death_pipe[2];
    int sync_pipe[2];
    int ret;
    int efd = -1;

    (void) pthread_once(&forkfd_initialization, forkfd_initialize);

    info = allocateInfo(&header);
    if (info == NULL) {
        errno = ENOMEM;
        return -1;
    }

    /* create the pipes before we fork */
    if (create_pipe(death_pipe, flags) == -1)
        goto err_free; /* failed to create the pipes, pass errno */

#ifdef HAVE_EVENTFD
    /* try using an eventfd, which consumes less resources */
    efd = eventfd(0, EFD_CLOEXEC);
#endif
    if (efd == -1) {
        /* try a pipe */
        if (create_pipe(sync_pipe, FFD_CLOEXEC) == -1) {
            /* failed both at eventfd and pipe; fail and pass errno */
            goto err_close;
        }
    }

    /* now fork */
    pid = fork();
    if (pid == -1)
        goto err_close2; /* failed to fork, pass errno */
    if (ppid)
        *ppid = pid;

    /*
     * We need to store the child's PID in the info structure, so
     * the SIGCHLD handler knows that this child is present and it
     * knows the writing end of the pipe to pass information on.
     * However, the child process could exit before we stored the
     * information (or the handler could run for other children exiting).
     * We prevent that from happening by blocking the child process in
     * a read(2) until we're finished storing the information.
     */
    if (pid == 0) {
        /* this is the child process */
        /* first, wait for the all clear */
        if (efd != -1) {
#ifdef HAVE_EVENTFD
            eventfd_t val64;
            EINTR_LOOP(ret, eventfd_read(efd, &val64));
            EINTR_LOOP(ret, close(efd));
#endif
        } else {
            char c;
            EINTR_LOOP(ret, close(sync_pipe[1]));
            EINTR_LOOP(ret, read(sync_pipe[0], &c, sizeof c));
            EINTR_LOOP(ret, close(sync_pipe[0]));
        }

        /* now close the pipes and return to the caller */
        EINTR_LOOP(ret, close(death_pipe[0]));
        EINTR_LOOP(ret, close(death_pipe[1]));
        fd = FFD_CHILD_PROCESS;
    } else {
        /* parent process */
        info->deathPipe = death_pipe[1];
        fd = death_pipe[0];
        ffd_atomic_store(&info->pid, pid, FFD_ATOMIC_RELEASE);

        /* release the child */
#ifdef HAVE_EVENTFD
        if (efd != -1) {
            eventfd_t val64 = 42;
            EINTR_LOOP(ret, eventfd_write(efd, val64));
            EINTR_LOOP(ret, close(efd));
        } else
#endif
        {
            /*
             * Usually, closing would be enough to make read(2) return and the child process
             * continue. We need to write here: another thread could be calling forkfd at the
             * same time, which means auxpipe[1] might be open in another child process.
             */
            EINTR_LOOP(ret, close(sync_pipe[0]));
            EINTR_LOOP(ret, write(sync_pipe[1], "", 1));
            EINTR_LOOP(ret, close(sync_pipe[1]));
        }
    }

    return fd;

err_close2:
#ifdef HAVE_EVENTFD
    if (efd != -1) {
        EINTR_LOOP(ret, close(efd));
    } else
#endif
    {
        EINTR_LOOP(ret, close(sync_pipe[0]));
        EINTR_LOOP(ret, close(sync_pipe[1]));
    }
err_close:
    EINTR_LOOP(ret, close(death_pipe[0]));
    EINTR_LOOP(ret, close(death_pipe[1]));
err_free:
    /* free the info pointer */
    freeInfo(header, info);
    return -1;
}